

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void bolt_pict(wchar_t y,wchar_t x,wchar_t ny,wchar_t nx,wchar_t typ,uint8_t *a,wchar_t *c)

{
  wchar_t local_48 [2];
  wchar_t chars [6];
  wchar_t motion;
  uint8_t *a_local;
  wchar_t typ_local;
  wchar_t nx_local;
  wchar_t ny_local;
  wchar_t x_local;
  wchar_t y_local;
  
  if ((ny == y) && (nx == x)) {
    chars[5] = L'\0';
  }
  else if (nx == x) {
    chars[5] = L'\x01';
  }
  else if (ny - y == x - nx) {
    chars[5] = L'\x02';
  }
  else if (ny == y) {
    chars[5] = L'\x03';
  }
  else if (ny - y == nx - x) {
    chars[5] = L'\x04';
  }
  else {
    chars[5] = L'\0';
  }
  if (use_graphics == L'\0') {
    builtin_wcsncpy(chars,L"/-\\",4);
    *c = chars[(long)chars[5] + -2];
    *a = (uint8_t)projections[typ].color;
  }
  else {
    *a = proj_to_attr[typ][chars[5]];
    *c = proj_to_char[typ][chars[5]];
  }
  return;
}

Assistant:

static void bolt_pict(int y, int x, int ny, int nx, int typ, uint8_t *a,
					  wchar_t *c)
{
	int motion;

	/* Convert co-ordinates into motion */
	if ((ny == y) && (nx == x))
		motion = BOLT_NO_MOTION;
	else if (nx == x)
		motion = BOLT_0;
	else if ((ny-y) == (x-nx))
		motion = BOLT_45;
	else if (ny == y)
		motion = BOLT_90;
	else if ((ny-y) == (nx-x))
		motion = BOLT_135;
	else
		motion = BOLT_NO_MOTION;

	/* Decide on output char */
	if (use_graphics == GRAPHICS_NONE) {
		/* ASCII is simple */
		wchar_t chars[] = L"*|/-\\";

		*c = chars[motion];
		*a = projections[typ].color;
	} else {
		*a = proj_to_attr[typ][motion];
		*c = proj_to_char[typ][motion];
	}
}